

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void estimateIndexWidth(Index *pIdx)

{
  short sVar1;
  LogEst LVar2;
  long in_RDI;
  i16 x;
  Column *aCol;
  int i;
  uint wIndex;
  undefined4 local_20;
  undefined4 local_10;
  undefined4 local_c;
  
  local_c = 0;
  for (local_10 = 0; local_10 < (int)(uint)*(ushort *)(in_RDI + 0x60); local_10 = local_10 + 1) {
    sVar1 = *(short *)(*(long *)(in_RDI + 8) + (long)local_10 * 2);
    if (sVar1 < 0) {
      local_20 = 1;
    }
    else {
      local_20 = (uint)*(byte *)(*(long *)(*(long *)(in_RDI + 0x18) + 8) + (long)sVar1 * 0x10 + 10);
    }
    local_c = local_20 + local_c;
  }
  LVar2 = sqlite3LogEst((ulong)(uint)(local_c << 2));
  *(LogEst *)(in_RDI + 0x5c) = LVar2;
  return;
}

Assistant:

static void estimateIndexWidth(Index *pIdx){
  unsigned wIndex = 0;
  int i;
  const Column *aCol = pIdx->pTable->aCol;
  for(i=0; i<pIdx->nColumn; i++){
    i16 x = pIdx->aiColumn[i];
    assert( x<pIdx->pTable->nCol );
    wIndex += x<0 ? 1 : aCol[x].szEst;
  }
  pIdx->szIdxRow = sqlite3LogEst(wIndex*4);
}